

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O1

void splitLine(wstring *line,wstring *name,wstring *arguments)

{
  wchar_t wVar1;
  uint uVar2;
  pointer pwVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = 0;
  std::__cxx11::wstring::_M_replace((ulong)name,0,(wchar_t *)name->_M_string_length,0x151870);
  std::__cxx11::wstring::_M_replace
            ((ulong)arguments,0,(wchar_t *)arguments->_M_string_length,0x151870);
  uVar2 = (uint)line->_M_string_length;
  if (0 < (int)uVar2) {
    uVar6 = 0;
    do {
      wVar1 = (line->_M_dataplus)._M_p[uVar6];
      if ((wVar1 != L' ') && (wVar1 != L'\t')) goto LAB_0013e0c4;
      uVar6 = uVar6 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar6);
    uVar6 = line->_M_string_length & 0xffffffff;
  }
LAB_0013e0c4:
  uVar2 = (uint)line->_M_string_length;
  if ((int)uVar6 < (int)uVar2) {
    uVar6 = uVar6 & 0xffffffff;
    do {
      wVar1 = (line->_M_dataplus)._M_p[uVar6];
      if (wVar1 == L'\0') {
        return;
      }
      if (wVar1 == L' ') break;
      uVar6 = uVar6 + 1;
      std::__cxx11::wstring::push_back((wchar_t)name);
      uVar2 = (uint)line->_M_string_length;
    } while ((int)uVar6 < (int)uVar2);
  }
  uVar5 = (uint)uVar6;
  if ((int)(uint)uVar6 < (int)uVar2) {
    pwVar3 = (line->_M_dataplus)._M_p + (uVar6 & 0xffffffff);
    do {
      if ((*pwVar3 != L' ') && (uVar5 = (uint)uVar6, *pwVar3 != L'\t')) break;
      uVar4 = (uint)uVar6 + 1;
      uVar6 = (ulong)uVar4;
      pwVar3 = pwVar3 + 1;
      uVar5 = uVar2;
    } while ((int)uVar4 < (int)uVar2);
  }
  if ((int)uVar5 < (int)line->_M_string_length) {
    uVar6 = (ulong)uVar5;
    do {
      if ((line->_M_dataplus)._M_p[uVar6] == L'\0') {
        return;
      }
      uVar6 = uVar6 + 1;
      std::__cxx11::wstring::push_back((wchar_t)arguments);
    } while ((int)uVar6 < (int)line->_M_string_length);
  }
  return;
}

Assistant:

void splitLine(std::wstring& line, std::wstring& name, std::wstring& arguments)
{
	int linePos = 0;
	name = L"";
	arguments = L"";

	while (linePos < (int)line.size() && (line[linePos] == ' ' || line[linePos] == '\t')) linePos++;
	while (linePos < (int)line.size() && line[linePos] != ' ')
	{
		if (line[linePos]  == 0)
		{
			return;
		}
		name += line[linePos++];
	}
	
	while (linePos < (int)line.size() && (line[linePos] == ' ' || line[linePos] == '\t')) linePos++;

	while (linePos < (int)line.size() && line[linePos] != 0)
	{
		arguments += line[linePos++];
	}
}